

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void hta::throw_exception<hta::Exception,char_const*>(char *args)

{
  runtime_error *this;
  stringstream msg;
  make_exception<const_char_*> local_1c0 [32];
  stringstream local_1a0 [392];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  detail::make_exception<const_char_*>::operator()(local_1c0,(stringstream *)local_1a0,args);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)local_1c0);
  *(undefined ***)this = &PTR__runtime_error_00122a98;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}